

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLoadsBody.cpp
# Opt level: O2

void __thiscall
chrono::ChLoadBodyInertia::LoadIntLoadResidual_Mv
          (ChLoadBodyInertia *this,ChVectorDynamic<> *R,ChVectorDynamic<> *w,double c)

{
  element_type *peVar1;
  int iVar2;
  uint uVar3;
  double c_local;
  double local_158;
  double dStack_150;
  double local_148;
  double dStack_140;
  ChVector<double> a_x;
  ChVector<double> *local_118;
  double dStack_110;
  double local_108;
  double local_f8;
  double dStack_f0;
  double local_e8;
  ChVector<double> a_w;
  MatrixBase<Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_>
  local_c0 [56];
  ChVector<double> *local_88 [2];
  ChVector<double> v;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>
  local_60;
  
  if ((this->super_ChLoadCustom).super_ChLoadBase.jacobians != (ChLoadJacobians *)0x0) {
    peVar1 = (this->super_ChLoadCustom).loadable.
             super___shared_ptr<chrono::ChLoadable,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    c_local = c;
    iVar2 = (*peVar1->_vptr_ChLoadable[0xb])(peVar1,0);
    if ((char)iVar2 != '\0') {
      peVar1 = (this->super_ChLoadCustom).loadable.
               super___shared_ptr<chrono::ChLoadable,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      uVar3 = (*peVar1->_vptr_ChLoadable[9])(peVar1,0);
      Eigen::VectorBlock<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1>::VectorBlock
                ((VectorBlock<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1> *)local_c0,w,
                 (ulong)uVar3,3);
      ChVector<double>::ChVector<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>const,_1,1,false>>
                (&a_x,local_c0,(type *)0x0);
      peVar1 = (this->super_ChLoadCustom).loadable.
               super___shared_ptr<chrono::ChLoadable,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      iVar2 = (*peVar1->_vptr_ChLoadable[9])(peVar1,0);
      Eigen::VectorBlock<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1>::VectorBlock
                ((VectorBlock<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1> *)local_c0,w,
                 (ulong)(iVar2 + 3),3);
      ChVector<double>::ChVector<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>const,_1,1,false>>
                (&a_w,local_c0,(type *)0x0);
      local_148 = this->mass;
      dStack_140 = local_148;
      Vcross<double,double>(&a_w,&this->c_m);
      v.m_data[0] = local_148 * (a_x.m_data[0] + local_f8);
      v.m_data[1] = dStack_140 * (a_x.m_data[1] + dStack_f0);
      v.m_data[2] = local_148 * (a_x.m_data[2] + local_e8);
      local_118 = &v;
      Eigen::operator*(&local_60,&c_local,(StorageBaseType *)&local_118);
      peVar1 = (this->super_ChLoadCustom).loadable.
               super___shared_ptr<chrono::ChLoadable,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      uVar3 = (*peVar1->_vptr_ChLoadable[9])(peVar1,0);
      Eigen::VectorBlock<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1>::VectorBlock
                ((VectorBlock<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1> *)local_c0,R,(ulong)uVar3,
                 3);
      Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,-1,1,0,-1,1>,-1,1,false>>::operator+=
                ((MatrixBase<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false>> *)local_c0,
                 (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>_>
                  *)&local_60);
      local_158 = this->mass;
      dStack_150 = local_158;
      Vcross<double,double>(&this->c_m,&a_x);
      local_148 = local_158 * local_e8;
      local_158 = local_158 * local_f8;
      dStack_150 = dStack_150 * dStack_f0;
      ChMatrix33<double>::operator*(&this->I,&a_w);
      v.m_data[0] = local_158 + (double)local_118;
      v.m_data[1] = dStack_150 + dStack_110;
      v.m_data[2] = local_148 + local_108;
      local_88[0] = &v;
      Eigen::operator*(&local_60,&c_local,(StorageBaseType *)local_88);
      peVar1 = (this->super_ChLoadCustom).loadable.
               super___shared_ptr<chrono::ChLoadable,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      iVar2 = (*peVar1->_vptr_ChLoadable[9])(peVar1,0);
      Eigen::VectorBlock<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1>::VectorBlock
                ((VectorBlock<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1> *)local_c0,R,
                 (ulong)(iVar2 + 3),3);
      Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,-1,1,0,-1,1>,-1,1,false>>::operator+=
                ((MatrixBase<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false>> *)local_c0,
                 (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>_>
                  *)&local_60);
    }
  }
  return;
}

Assistant:

void ChLoadBodyInertia::LoadIntLoadResidual_Mv(ChVectorDynamic<>& R, const ChVectorDynamic<>& w, const double c) {
    if (!this->jacobians)
        return;

    if (!loadable->IsSubBlockActive(0))
        return;

    // fetch w as a contiguous vector
    ChVector<> a_x = w.segment(loadable->GetSubBlockOffset(0), 3);
    ChVector<> a_w = w.segment(loadable->GetSubBlockOffset(0)+3, 3);

    // R+=c*M*a  
    R.segment(loadable->GetSubBlockOffset(0), 3)   += c * (this->mass * (a_x + chrono::Vcross(a_w, this->c_m))).eigen();
    R.segment(loadable->GetSubBlockOffset(0)+3, 3) += c * (this->mass * chrono::Vcross(this->c_m, a_x) + this->I * a_w).eigen();
}